

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

GeneratorTracker *
Catch::Generators::GeneratorTracker::acquire(TrackerContext *ctx,NameAndLocation *nameAndLocation)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ITracker *this;
  NameAndLocation *lhs;
  undefined4 extraout_var;
  element_type *peVar4;
  element_type *peVar5;
  int __oflag;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  shared_ptr<Catch::TestCaseTracking::ITracker> local_a8;
  ITracker *local_98;
  undefined1 local_90 [16];
  shared_ptr<Catch::Generators::GeneratorTracker> local_80;
  undefined1 local_70 [8];
  ITrackerPtr childTracker;
  undefined1 local_50 [8];
  ITrackerPtr thisTracker;
  ITracker *currentTracker;
  shared_ptr<Catch::Generators::GeneratorTracker> tracker;
  NameAndLocation *nameAndLocation_local;
  TrackerContext *ctx_local;
  
  tracker.super___shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)nameAndLocation;
  clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::shared_ptr
            ((shared_ptr<Catch::Generators::GeneratorTracker> *)&currentTracker);
  this = TestCaseTracking::TrackerContext::currentTracker(ctx);
  lhs = TestCaseTracking::ITracker::nameAndLocation(this);
  bVar1 = TestCaseTracking::operator==
                    (lhs,(NameAndLocation *)
                         tracker.
                         super___shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
  if (bVar1) {
    iVar2 = (*this->_vptr_ITracker[7])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x60))
              (local_50,(long *)CONCAT44(extraout_var,iVar2),
               tracker.
               super___shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
    if (!bVar1) {
      __assert_fail("thisTracker",
                    "/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/build_O0/tests/catch2/catch.hpp"
                    ,0x3143,
                    "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                   );
    }
    peVar4 = clara::std::
             __shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    uVar3 = (*peVar4->_vptr_ITracker[0xf])();
    if ((uVar3 & 1) == 0) {
      __assert_fail("thisTracker->isGeneratorTracker()",
                    "/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/build_O0/tests/catch2/catch.hpp"
                    ,0x3144,
                    "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                   );
    }
    std::static_pointer_cast<Catch::Generators::GeneratorTracker,Catch::TestCaseTracking::ITracker>
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)
               &childTracker.
                super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    __r = &childTracker.
           super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount;
    clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::operator=
              ((shared_ptr<Catch::Generators::GeneratorTracker> *)&currentTracker,
               (shared_ptr<Catch::Generators::GeneratorTracker> *)__r);
    clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::~shared_ptr
              ((shared_ptr<Catch::Generators::GeneratorTracker> *)
               &childTracker.
                super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    clara::std::shared_ptr<Catch::TestCaseTracking::ITracker>::~shared_ptr
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)local_50);
  }
  else {
    (*this->_vptr_ITracker[0xc])
              (local_70,this,
               tracker.
               super___shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_70);
    if (bVar1) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_70);
      if (!bVar1) {
        __assert_fail("childTracker",
                      "/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/build_O0/tests/catch2/catch.hpp"
                      ,0x3147,
                      "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                     );
      }
      peVar4 = clara::std::
               __shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_70);
      uVar3 = (*peVar4->_vptr_ITracker[0xf])();
      if ((uVar3 & 1) == 0) {
        __assert_fail("childTracker->isGeneratorTracker()",
                      "/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/build_O0/tests/catch2/catch.hpp"
                      ,0x3148,
                      "static GeneratorTracker &Catch::Generators::GeneratorTracker::acquire(TrackerContext &, const TestCaseTracking::NameAndLocation &)"
                     );
      }
      std::
      static_pointer_cast<Catch::Generators::GeneratorTracker,Catch::TestCaseTracking::ITracker>
                ((shared_ptr<Catch::TestCaseTracking::ITracker> *)&local_80);
      __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80;
      clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::operator=
                ((shared_ptr<Catch::Generators::GeneratorTracker> *)&currentTracker,
                 (shared_ptr<Catch::Generators::GeneratorTracker> *)__r);
      clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::~shared_ptr(&local_80);
    }
    else {
      local_98 = this;
      std::
      make_shared<Catch::Generators::GeneratorTracker,Catch::TestCaseTracking::NameAndLocation_const&,Catch::TestCaseTracking::TrackerContext&,Catch::TestCaseTracking::ITracker*>
                ((NameAndLocation *)local_90,
                 (TrackerContext *)
                 tracker.
                 super___shared_ptr<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi,(ITracker **)ctx);
      clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::operator=
                ((shared_ptr<Catch::Generators::GeneratorTracker> *)&currentTracker,
                 (shared_ptr<Catch::Generators::GeneratorTracker> *)local_90);
      clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::~shared_ptr
                ((shared_ptr<Catch::Generators::GeneratorTracker> *)local_90);
      __r = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8;
      std::shared_ptr<Catch::TestCaseTracking::ITracker>::
      shared_ptr<Catch::Generators::GeneratorTracker,void>
                ((shared_ptr<Catch::TestCaseTracking::ITracker> *)__r,
                 (shared_ptr<Catch::Generators::GeneratorTracker> *)&currentTracker);
      (*this->_vptr_ITracker[0xb])();
      clara::std::shared_ptr<Catch::TestCaseTracking::ITracker>::~shared_ptr(&local_a8);
    }
    clara::std::shared_ptr<Catch::TestCaseTracking::ITracker>::~shared_ptr
              ((shared_ptr<Catch::TestCaseTracking::ITracker> *)local_70);
  }
  peVar5 = clara::std::
           __shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&currentTracker);
  uVar3 = (*(peVar5->super_TrackerBase).super_ITracker._vptr_ITracker[2])();
  if ((uVar3 & 1) == 0) {
    peVar5 = clara::std::
             __shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&currentTracker);
    TestCaseTracking::TrackerBase::open(&peVar5->super_TrackerBase,(char *)__r,__oflag);
  }
  peVar5 = clara::std::
           __shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<Catch::Generators::GeneratorTracker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&currentTracker);
  clara::std::shared_ptr<Catch::Generators::GeneratorTracker>::~shared_ptr
            ((shared_ptr<Catch::Generators::GeneratorTracker> *)&currentTracker);
  return peVar5;
}

Assistant:

static GeneratorTracker& acquire( TrackerContext& ctx, TestCaseTracking::NameAndLocation const& nameAndLocation ) {
                std::shared_ptr<GeneratorTracker> tracker;

                ITracker& currentTracker = ctx.currentTracker();
                // Under specific circumstances, the generator we want
                // to acquire is also the current tracker. If this is
                // the case, we have to avoid looking through current
                // tracker's children, and instead return the current
                // tracker.
                // A case where this check is important is e.g.
                //     for (int i = 0; i < 5; ++i) {
                //         int n = GENERATE(1, 2);
                //     }
                //
                // without it, the code above creates 5 nested generators.
                if (currentTracker.nameAndLocation() == nameAndLocation) {
                    auto thisTracker = currentTracker.parent().findChild(nameAndLocation);
                    assert(thisTracker);
                    assert(thisTracker->isGeneratorTracker());
                    tracker = std::static_pointer_cast<GeneratorTracker>(thisTracker);
                } else if ( TestCaseTracking::ITrackerPtr childTracker = currentTracker.findChild( nameAndLocation ) ) {
                    assert( childTracker );
                    assert( childTracker->isGeneratorTracker() );
                    tracker = std::static_pointer_cast<GeneratorTracker>( childTracker );
                } else {
                    tracker = std::make_shared<GeneratorTracker>( nameAndLocation, ctx, &currentTracker );
                    currentTracker.addChild( tracker );
                }

                if( !tracker->isComplete() ) {
                    tracker->open();
                }

                return *tracker;
            }